

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

double __thiscall chrono::viper::Viper::GetRoverMass(Viper *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double local_48;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((this->m_chassis).
                super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ViperPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_48 = *(double *)(local_40._M_ptr + 0x2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  for (lVar4 = -0x40; lVar4 != 0; lVar4 = lVar4 + 0x10) {
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_upper_arms)._M_elems[0].
                                 super___shared_ptr<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar4) + 0x28));
    dVar1 = *(double *)(local_40._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_lower_arms)._M_elems[0].
                                 super___shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar4) + 0x28));
    dVar2 = *(double *)(local_40._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_uprights)._M_elems[0].
                                 super___shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar4) + 0x28));
    dVar3 = *(double *)(local_40._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_steering_rods)._M_elems[0].
                                 super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + lVar4) + 0x28));
    local_48 = local_48 + dVar1 + dVar2 + dVar3 + *(double *)(local_40._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return local_48;
}

Assistant:

double Viper::GetRoverMass() const {
    double tot_mass = m_chassis->GetBody()->GetMass();
    for (int i = 0; i < 4; i++) {
        tot_mass += m_wheels[i]->GetBody()->GetMass();
        tot_mass += m_upper_arms[i]->GetBody()->GetMass();
        tot_mass += m_lower_arms[i]->GetBody()->GetMass();
        tot_mass += m_uprights[i]->GetBody()->GetMass();
    }
    return tot_mass;
}